

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O2

void __thiscall
slang::ast::ParameterBuilder::ParameterBuilder
          (ParameterBuilder *this,Scope *scope,string_view definitionName,
          span<const_slang::ast::Definition::ParameterDecl,_18446744073709551615UL> parameterDecls)

{
  this->scope = scope;
  (this->definitionName)._M_len = definitionName._M_len;
  (this->definitionName)._M_str = definitionName._M_str;
  (this->parameterDecls).data_ = parameterDecls.data_;
  (this->parameterDecls).size_ = parameterDecls.size_;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*,_8UL,_ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ExpressionSyntax_*>_>,_8UL>_>
  ::SmallMap(&this->assignments);
  this->instanceContext = (ASTContext *)0x0;
  this->overrideNode = (ParamOverrideNode *)0x0;
  *(undefined4 *)((long)&this->overrideNode + 7) = 0;
  return;
}

Assistant:

ParameterBuilder::ParameterBuilder(const Scope& scope, string_view definitionName,
                                   span<const Decl> parameterDecls) :
    scope(scope),
    definitionName(definitionName), parameterDecls(parameterDecls) {
}